

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall
sf::priv::GlxContext::GlxContext
          (GlxContext *this,GlxContext *shared,ContextSettings *settings,uint width,uint height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Display *pDVar4;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  uint in_stack_000000dc;
  uint in_stack_000000e0;
  uint in_stack_000000e4;
  GlxContext *in_stack_000000e8;
  GlxContext *in_stack_000000f0;
  GlxContext *in_stack_000001c8;
  GlxContext *in_stack_000001d0;
  undefined8 in_stack_ffffffffffffff88;
  int screen;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  GlContext *in_stack_ffffffffffffffb0;
  
  screen = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  GlContext::GlContext(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__GlxContext_001d7c38;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  uVar3 = *(undefined8 *)((long)in_RDX + 0x11);
  *(undefined8 *)((long)in_RDI + 0x11) = *(undefined8 *)((long)in_RDX + 9);
  *(undefined8 *)((long)in_RDI + 0x19) = uVar3;
  in_RDI[1] = uVar1;
  in_RDI[2] = uVar2;
  pDVar4 = OpenDisplay();
  in_RDI[6] = pDVar4;
  ensureExtensionsInit
            ((Display *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),screen);
  VideoMode::getDesktopMode();
  createSurface(in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000e0,
                in_stack_000000dc);
  createContext(in_stack_000001d0,in_stack_000001c8);
  return;
}

Assistant:

GlxContext::GlxContext(GlxContext* shared, const ContextSettings& settings, unsigned int width, unsigned int height) :
m_display   (NULL),
m_window    (0),
m_context   (NULL),
m_pbuffer   (0),
m_ownsWindow(false)
{
    // Save the creation settings
    m_settings = settings;

    // Open the connection with the X server
    m_display = OpenDisplay();

    // Make sure that extensions are initialized
    ensureExtensionsInit(m_display, DefaultScreen(m_display));

    // Create the rendering surface (window or pbuffer if supported)
    createSurface(shared, width, height, VideoMode::getDesktopMode().bitsPerPixel);

    // Create the context
    createContext(shared);
}